

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int16_suite::test_array16_int16(void)

{
  value_type expected [4];
  value_type input [7];
  decoder decoder;
  value local_6c;
  value local_68 [2];
  uchar local_60 [8];
  decoder local_58;
  
  local_60[4] = '4';
  local_60[5] = 'V';
  local_60[6] = 'x';
  local_60[0] = 0xba;
  local_60[1] = '\x04';
  local_60[2] = '\0';
  local_60[3] = '\x12';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[7]>
            (&local_58,(uchar (*) [7])local_60);
  local_6c = local_58.current.code;
  local_68[0] = 0xba;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x72d,"void compact_int16_suite::test_array16_int16()",&local_6c,local_68);
  local_6c = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_68[0] = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x72e,"void compact_int16_suite::test_array16_int16()",&local_6c,local_68);
  local_6c = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_68[0] = data;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x72f,"void compact_int16_suite::test_array16_int16()",&local_6c,local_68);
  local_6c = 0x78563412;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x735,"void compact_int16_suite::test_array16_int16()",local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,&local_6c,local_68);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_68[0] = local_58.current.code;
  local_68[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x737,"void compact_int16_suite::test_array16_int16()",local_68,local_68 + 1);
  return;
}

Assistant:

void test_array16_int16()
{
    const value_type input[] = { token::code::array16_int16, 0x04, 0x00, 0x12, 0x34, 0x56, 0x78 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x12, 0x34, 0x56, 0x78
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}